

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

string * __thiscall Tracker::logAverage(string *__return_storage_ptr__,Tracker *this,string *_track)

{
  double dVar1;
  ulong uVar2;
  bool bVar3;
  pointer ppVar4;
  size_type sVar5;
  reference pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string local_1c8;
  double local_1a8;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ulong local_80;
  size_t i;
  double delta;
  double average;
  string track_name;
  allocator local_31;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *_track_local;
  Tracker *this_local;
  string *log;
  
  it._M_node = (_Base_ptr)_track;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
       ::find(&this->m_data,_track);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
       ::end(&this->m_data);
  bVar3 = std::operator==(&local_28,&local_30);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    track_name.field_2._M_local_buf[0xb] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",
               (allocator *)(track_name.field_2._M_local_buf + 10));
    std::allocator<char>::~allocator((allocator<char> *)(track_name.field_2._M_local_buf + 10));
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)&average,(string *)ppVar4);
    delta = 0.0;
    i = 0;
    local_80 = 0;
    while( true ) {
      uVar2 = local_80;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
               ::operator->(&local_28);
      sVar5 = std::vector<StatSample,_std::allocator<StatSample>_>::size(&(ppVar4->second).samples);
      if (sVar5 <= uVar2) break;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
               ::operator->(&local_28);
      pvVar6 = std::vector<StatSample,_std::allocator<StatSample>_>::operator[]
                         (&(ppVar4->second).samples,local_80);
      delta = pvVar6->durationMs + delta;
      if (local_80 != 0) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
                 ::operator->(&local_28);
        pvVar6 = std::vector<StatSample,_std::allocator<StatSample>_>::operator[]
                           (&(ppVar4->second).samples,local_80);
        dVar1 = pvVar6->startMs;
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
                 ::operator->(&local_28);
        pvVar6 = std::vector<StatSample,_std::allocator<StatSample>_>::operator[]
                           (&(ppVar4->second).samples,local_80 - 1);
        i = (size_t)((dVar1 - pvVar6->startMs) + (double)i);
      }
      local_80 = local_80 + 1;
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
             ::operator->(&local_28);
    sVar5 = std::vector<StatSample,_std::allocator<StatSample>_>::size(&(ppVar4->second).samples);
    auVar7._8_4_ = (int)(sVar5 >> 0x20);
    auVar7._0_8_ = sVar5;
    auVar7._12_4_ = 0x45300000;
    delta = delta / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
             ::operator->(&local_28);
    sVar5 = std::vector<StatSample,_std::allocator<StatSample>_>::size(&(ppVar4->second).samples);
    dVar1 = delta;
    auVar8._8_4_ = (int)(sVar5 >> 0x20);
    auVar8._0_8_ = sVar5;
    auVar8._12_4_ = 0x45300000;
    i = (size_t)((double)i /
                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0) + -1.0));
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
             ::operator->(&local_28);
    (ppVar4->second).durationAverage = dVar1;
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&average,","
                  );
    vera::toString<double>(&local_180,&delta);
    std::operator+(&local_140,&local_160,&local_180);
    std::operator+(&local_120,&local_140,",");
    local_1a8 = (delta / (double)i) * 100.0;
    vera::toString<double>(&local_1a0,&local_1a8);
    std::operator+(&local_100,&local_120,&local_1a0);
    std::operator+(&local_e0,&local_100,",");
    vera::toString<double>(&local_1c8,(double *)&i);
    std::operator+(&local_c0,&local_e0,&local_1c8);
    std::operator+(&local_a0,&local_c0,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_160);
    track_name.field_2._M_local_buf[0xb] = '\x01';
    std::__cxx11::string::~string((string *)&average);
    if ((track_name.field_2._M_local_buf[0xb] & 1U) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logAverage(const std::string& _track) {
    std::map<std::string, StatTrack>::iterator it = m_data.find(_track);

    if ( it == m_data.end() )
        return "";

    std::string log = "";
    std::string track_name = it->first;

    double average = 0.0;
    double delta = 0.0;
    for (size_t i = 0; i < it->second.samples.size(); i++) {
        average += it->second.samples[i].durationMs;
        if (i > 0)
            delta += it->second.samples[i].startMs - it->second.samples[i-1].startMs;
    }

    average /= (double)it->second.samples.size();
    delta /= (double)it->second.samples.size() - 1.0;
    it->second.durationAverage = average;
    
    log += track_name + "," + vera::toString(average) + "," + vera::toString( (average/delta) * 100.0) + "," + vera::toString(delta) +  "\n";

    return log;
}